

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_cstr.c
# Opt level: O1

size_t zt_cstr_chr(char *s,ssize_t i,ssize_t j,int c)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  
  sVar1 = strlen(s);
  if (sVar1 == 0) {
    sVar3 = 0;
    sVar2 = 0;
  }
  else {
    if (i < 0) {
      sVar4 = sVar1 - 1;
      if ((long)(i + sVar1) < (long)sVar1) {
        sVar4 = i + sVar1;
      }
    }
    else {
      sVar4 = sVar1 - 1;
      if (i < (long)sVar1) {
        sVar4 = i;
      }
    }
    if (j < 0) {
      sVar2 = sVar1 - 1;
      if ((long)(j + sVar1) < (long)sVar1) {
        sVar2 = j + sVar1;
      }
    }
    else {
      sVar2 = sVar1 - 1;
      if (j < (long)sVar1) {
        sVar2 = j;
      }
    }
    sVar3 = sVar2;
    if ((long)sVar2 < (long)sVar4) {
      sVar3 = sVar4;
    }
    if ((long)sVar4 < (long)sVar2) {
      sVar2 = sVar4;
    }
  }
  if ((long)sVar2 <= (long)sVar3) {
    do {
      if (s[sVar2] == c) {
        return sVar2;
      }
      sVar2 = sVar2 + 1;
    } while (sVar3 + 1 != sVar2);
  }
  return 0;
}

Assistant:

size_t
zt_cstr_chr(const char *s, ssize_t i, ssize_t j, int c) {
    zt_assert(s);

    CONVERT(s, i, j);
    for (; i <= j; i++) {
        if (s[i] == c) {
            return (size_t)i;
        }
    }

    return 0;
}